

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::MatchExpr::~MatchExpr(MatchExpr *this)

{
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&this->anyCase);
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::~vector(&this->cases);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->expr);
  return;
}

Assistant:

MatchExpr::~MatchExpr() {
}